

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReadBlob(PmaReader *p,int nByte,u8 **ppOut)

{
  int iVar1;
  long lVar2;
  u64 local_68;
  u8 *local_60;
  u8 *aNext;
  int nCopy;
  int rc_1;
  sqlite3_int64 nNew;
  u8 *aNew;
  undefined4 local_38;
  int nRem;
  int rc;
  int nRead;
  int nAvail;
  int iBuf;
  u8 **ppOut_local;
  PmaReader *pPStack_18;
  int nByte_local;
  PmaReader *p_local;
  
  if (p->aMap == (u8 *)0x0) {
    nRead = (int)(p->iReadOff % (long)p->nBuffer);
    _nAvail = ppOut;
    ppOut_local._4_4_ = nByte;
    pPStack_18 = p;
    if (nRead == 0) {
      if ((long)p->nBuffer < p->iEof - p->iReadOff) {
        nRem = p->nBuffer;
      }
      else {
        nRem = (int)p->iEof - (int)p->iReadOff;
      }
      iVar1 = sqlite3OsRead(p->pFd,p->aBuffer,nRem,p->iReadOff);
      if (iVar1 != 0) {
        return iVar1;
      }
      local_38 = 0;
    }
    rc = pPStack_18->nBuffer - nRead;
    if (rc < ppOut_local._4_4_) {
      if (pPStack_18->nAlloc < ppOut_local._4_4_) {
        lVar2 = (long)pPStack_18->nAlloc * 2;
        if (lVar2 == 0x80 || SBORROW8(0x80,lVar2) != (long)pPStack_18->nAlloc * -2 + 0x80 < 0) {
          local_68 = (long)pPStack_18->nAlloc << 1;
        }
        else {
          local_68 = 0x80;
        }
        for (_nCopy = local_68; (long)_nCopy < (long)ppOut_local._4_4_; _nCopy = _nCopy << 1) {
        }
        nNew = (sqlite3_int64)sqlite3Realloc(pPStack_18->aAlloc,_nCopy);
        if ((u8 *)nNew == (u8 *)0x0) {
          return 7;
        }
        pPStack_18->nAlloc = (int)_nCopy;
        pPStack_18->aAlloc = (u8 *)nNew;
      }
      memcpy(pPStack_18->aAlloc,pPStack_18->aBuffer + nRead,(long)rc);
      pPStack_18->iReadOff = (long)rc + pPStack_18->iReadOff;
      for (aNew._4_4_ = ppOut_local._4_4_ - rc; 0 < aNew._4_4_; aNew._4_4_ = aNew._4_4_ - (int)aNext
          ) {
        aNext._0_4_ = aNew._4_4_;
        if (pPStack_18->nBuffer < aNew._4_4_) {
          aNext._0_4_ = pPStack_18->nBuffer;
        }
        aNext._4_4_ = vdbePmaReadBlob(pPStack_18,(int)aNext,&local_60);
        if (aNext._4_4_ != 0) {
          return aNext._4_4_;
        }
        memcpy(pPStack_18->aAlloc + (ppOut_local._4_4_ - aNew._4_4_),local_60,(long)(int)aNext);
      }
      *_nAvail = pPStack_18->aAlloc;
    }
    else {
      *_nAvail = pPStack_18->aBuffer + nRead;
      pPStack_18->iReadOff = (long)ppOut_local._4_4_ + pPStack_18->iReadOff;
    }
  }
  else {
    *ppOut = p->aMap + p->iReadOff;
    p->iReadOff = (long)nByte + p->iReadOff;
  }
  return 0;
}

Assistant:

static int vdbePmaReadBlob(
  PmaReader *p,                   /* PmaReader from which to take the blob */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */

  if( p->aMap ){
    *ppOut = &p->aMap[p->iReadOff];
    p->iReadOff += nByte;
    return SQLITE_OK;
  }

  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Readr data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFd, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf;

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      u8 *aNew;
      sqlite3_int64 nNew = MAX(128, 2*(sqlite3_int64)p->nAlloc);
      while( nByte>nNew ) nNew = nNew*2;
      aNew = sqlite3Realloc(p->aAlloc, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      p->nAlloc = nNew;
      p->aAlloc = aNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbePmaReadBlob() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbePmaReadBlob(p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}